

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ssl_connect_state sVar1;
  curl_proxytype cVar2;
  X509 *type;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var3;
  hostname *phVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  time_t timeout_ms;
  uint *puVar13;
  ulong uVar14;
  long lVar15;
  SSL_CIPHER *c;
  char *pcVar16;
  timediff_t tVar17;
  SSL_METHOD *meth;
  SSL_CTX *pSVar18;
  BIO_METHOD *pBVar19;
  BIO *pBVar20;
  stack_st_X509 *psVar21;
  BIO *out;
  X509 *pXVar22;
  X509_NAME *pXVar23;
  size_t sVar24;
  undefined8 uVar25;
  ASN1_INTEGER *pAVar26;
  ASN1_STRING *pAVar27;
  X509_EXTENSION *ex;
  BIO *out_00;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar28;
  EVP_PKEY *pEVar29;
  X509 *pXVar30;
  GENERAL_NAMES *a_00;
  int *piVar31;
  stack_st_X509 *__s;
  size_t sVar32;
  undefined8 extraout_RAX;
  PKCS12 *p12;
  X509_NAME_ENTRY *ne;
  SSL_SESSION *pSVar33;
  void *__src;
  Curl_easy *resp;
  FILE *pFVar34;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar35;
  OCSP_SINGLERESP *single;
  X509_PUBKEY *pXVar36;
  X509 *pXVar37;
  evp_pkey_st *peVar38;
  rsa_st *r;
  UI_METHOD *method;
  UI_METHOD *pUVar39;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *pSVar40;
  char cVar41;
  long lVar42;
  undefined7 uVar44;
  SSL_CTX *pSVar43;
  curl_socket_t writefd;
  long lVar45;
  size_t size;
  size_t size_00;
  CURLcode CVar46;
  int iVar47;
  long lVar48;
  size_t sVar49;
  long lVar50;
  char cVar51;
  curl_socket_t readfd0;
  long lVar52;
  Curl_easy *pCVar53;
  long lVar54;
  long lVar55;
  BIGNUM *bn;
  long lVar56;
  SSL_CTX *unaff_R12;
  ulong uVar57;
  ulong uVar58;
  char *pcVar59;
  Curl_easy *pCVar60;
  byte bVar61;
  bool bVar62;
  ssl_connect_data *connssl;
  char *ptr;
  EVP_PKEY *pri;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  int crl_reason;
  in6_addr addr;
  char error_buffer [256];
  ulong local_950;
  ASN1_GENERALIZEDTIME *local_948;
  SSL_SESSION *local_940;
  Curl_easy *local_938;
  X509 *local_930;
  char *local_928;
  stack_st_X509 *local_920;
  X509 *local_918;
  Curl_easy *local_910;
  undefined8 local_908;
  undefined8 local_900;
  char *local_8f8;
  ASN1_GENERALIZEDTIME *local_8f0;
  uint local_8e4;
  long local_8e0;
  X509 *local_8d8;
  SSL_CTX *local_8d0;
  long local_8c8;
  _Bool *local_8c0;
  X509 *local_8b8;
  X509 *local_8b0;
  X509 local_838 [2];
  undefined1 local_638 [1544];
  
  lVar12 = (long)sockindex;
  if (conn->ssl[lVar12].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_920 = (stack_st_X509 *)CONCAT44(local_920._4_4_,sockindex);
  pCVar53 = conn->data;
  local_930 = (X509 *)CONCAT44(local_930._4_4_,conn->sock[lVar12]);
  local_938 = pCVar53;
  local_8c8 = lVar12;
  local_8c0 = done;
  if (conn->ssl[lVar12].connecting_state == ssl_connect_1) {
    tVar17 = Curl_timeleft(pCVar53,(curltime *)0x0,true);
    if (tVar17 < 0) {
LAB_001479b7:
      Curl_failf(pCVar53,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    cVar2 = (conn->http_proxy).proxytype;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar48 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar48 = 0xd8;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar15 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar15 = 0x638;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar45 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar45 = 0x2f8;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar50 = 0x710, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar50 = 0x668;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar52 = 0x718, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar52 = 0x670;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar54 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar54 = 0x318;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar55 = 0x358, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar55 = 0x310;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar56 = 0x350, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar56 = 0x308;
    }
    pCVar53 = conn->data;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar42 = 0x6e8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar42 = 0x640;
    }
    local_908 = CONCAT44(local_908._4_4_,conn->sock[local_8c8]);
    local_910 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar48 + -0x20);
    uVar14 = *(ulong *)((conn->chunk).hexbuffer + lVar45 + -0x20);
    pXVar22 = *(X509 **)((long)pCVar53->sockets + lVar50 + -0x80);
    pXVar37 = *(X509 **)((long)pCVar53->sockets + lVar52 + -0x80);
    local_928 = *(char **)((conn->chunk).hexbuffer + lVar54 + -0x20);
    unaff_R12 = *(SSL_CTX **)((conn->chunk).hexbuffer + lVar55 + -0x20);
    bVar61 = (conn->chunk).hexbuffer[lVar56 + -0x20];
    pcVar59 = *(char **)((long)pCVar53->sockets + lVar42 + -0x80);
    local_8e0 = lVar12 * 3;
    CVar8 = Curl_ossl_seed(pCVar53);
    if (CVar8 == CURLE_OK) {
      local_900 = CONCAT44(local_900._4_4_,(uint)bVar61);
      *(undefined8 *)((long)pCVar53->sockets + lVar15 + -0x80) = 1;
      local_8f8 = pcVar59;
      local_8d0 = unaff_R12;
      if (uVar14 < 8) {
        if ((0xf3UL >> (uVar14 & 0x3f) & 1) == 0) {
          if (uVar14 == 2) {
switchD_00147b49_caseD_2:
            pcVar59 = "OpenSSL was built without SSLv2 support";
          }
          else {
            pcVar59 = "OpenSSL was built without SSLv3 support";
          }
          Curl_failf(pCVar53,pcVar59);
          CVar8 = CURLE_NOT_BUILT_IN;
          goto LAB_0014799c;
        }
        meth = (SSL_METHOD *)TLS_client_method();
        pSVar18 = (SSL_CTX *)(conn->ssl[lVar12].backend)->ctx;
        if (pSVar18 != (SSL_CTX *)0x0) {
          SSL_CTX_free(pSVar18);
        }
        pSVar18 = SSL_CTX_new(meth);
        (conn->ssl[lVar12].backend)->ctx = (SSL_CTX *)pSVar18;
        if (pSVar18 == (SSL_CTX *)0x0) {
          uVar14 = ERR_peek_error();
          ERR_error_string_n(uVar14,(char *)local_838,0x100);
          Curl_failf(pCVar53,"SSL: couldn\'t create a context: %s",local_838);
LAB_00147c9d:
          CVar8 = CURLE_OUT_OF_MEMORY;
          goto LAB_0014799c;
        }
        SSL_CTX_ctrl(pSVar18,0x21,0x10,(void *)0x0);
        if (((pCVar53->set).fdebug != (curl_debug_callback)0x0) && ((pCVar53->set).verbose == true))
        {
          SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,ssl_tls_trace);
          SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,0x10,0,conn);
        }
        uVar57 = 0x80024850;
        cVar2 = (conn->http_proxy).proxytype;
        if ((cVar2 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          cVar51 = (pCVar53->set).proxy_ssl.enable_beast;
        }
        else {
          cVar51 = (pCVar53->set).ssl.enable_beast;
        }
        if (cVar51 == '\0') {
          uVar57 = 0x80024050;
        }
        switch(uVar14) {
        case 0:
        case 1:
          uVar57 = uVar57 | 0x2000000;
          break;
        case 2:
          goto switchD_00147b49_caseD_2;
        case 3:
          uVar57 = uVar57 | 0x3c000000;
          break;
        case 4:
        case 5:
        case 6:
        case 7:
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar48 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar48 = 0x2f8;
          }
          lVar48 = *(long *)((conn->chunk).hexbuffer + lVar48 + -0x20);
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar15 = 0x348, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar15 = 0x300;
          }
          lVar15 = *(long *)((conn->chunk).hexbuffer + lVar15 + -0x20);
          lVar45 = lVar48 << 0x10;
          if (lVar15 != 0) {
            lVar45 = lVar15;
          }
          switch(lVar48) {
          case 7:
            SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].backend)[local_8e0]->ctx,0x7c,0x304,(void *)0x0);
            uVar57 = uVar57 | 0x8000000;
          case 6:
            uVar57 = uVar57 | 0x10000000;
          case 5:
            uVar57 = uVar57 | 0x4000000;
          case 4:
            uVar57 = uVar57 | 0x2000000;
          }
          switch(lVar45 << 0x30 | lVar45 - 0x10000U >> 0x10) {
          case 3:
            uVar57 = uVar57 | 0x10000000;
          case 4:
            uVar57 = uVar57 | 0x8000000;
          case 0:
          case 5:
            uVar57 = uVar57 | 0x20000000;
          }
          break;
        default:
          goto switchD_00147b49_default;
        }
        SSL_CTX_set_options((conn->ssl[lVar12].backend)->ctx,uVar57);
        if ((conn->bits).tls_enable_npn == true) {
          SSL_CTX_set_next_proto_select_cb
                    ((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,select_next_proto_cb,conn);
        }
        if ((conn->bits).tls_enable_alpn == true) {
          local_838[0].cert_info._0_1_ = 8;
          local_838[0].cert_info._1_7_ = 0x2e312f70747468;
          local_838[0].sig_alg._0_1_ = 0x31;
          Curl_infof(pCVar53,"ALPN, offering %s\n","http/1.1");
          SSL_CTX_set_alpn_protos((conn->ssl[lVar12].backend)->ctx,local_838,9);
        }
        if (pXVar22 != (X509 *)0x0 || pXVar37 != (X509 *)0x0) {
          cVar2 = (conn->http_proxy).proxytype;
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar48 = 0x720, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar48 = 0x678;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar15 = 0x728, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar15 = 0x680;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar45 = 0x730, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar45 = 0x688;
          }
          pSVar18 = (SSL_CTX *)(conn->ssl[lVar12].backend)->ctx;
          local_8d8 = *(X509 **)((long)pCVar53->sockets + lVar48 + -0x80);
          type = *(X509 **)((long)pCVar53->sockets + lVar15 + -0x80);
          pcVar59 = *(char **)((long)pCVar53->sockets + lVar45 + -0x80);
          pCVar60 = conn->data;
          iVar6 = do_file_type((char *)pXVar37);
          unaff_R12 = pSVar18;
          if (iVar6 == 0x2a || pXVar22 != (X509 *)0x0) {
            if (pcVar59 != (char *)0x0) {
              SSL_CTX_set_default_passwd_cb_userdata(pSVar18,pcVar59);
              SSL_CTX_set_default_passwd_cb(pSVar18,passwd_callback);
            }
            if (iVar6 < 0x2a) {
              if (iVar6 == 1) {
                iVar6 = SSL_CTX_use_certificate_chain_file(pSVar18,(char *)pXVar22);
                if (iVar6 != 1) {
                  uVar14 = ERR_get_error();
                  ERR_error_string_n(uVar14,(char *)local_838,0x100);
                  pcVar59 = 
                  "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
                  goto LAB_00149244;
                }
LAB_00149095:
                unaff_R12 = (SSL_CTX *)0x0;
LAB_00149c86:
                iVar6 = do_file_type((char *)type);
                if (iVar6 < 0x2a) {
                  pXVar37 = local_8d8;
                  if (iVar6 == 1) {
                    if ((int)unaff_R12 == 0) {
                      if (local_8d8 == (X509 *)0x0) {
                        pXVar37 = pXVar22;
                      }
                      goto LAB_00149cf2;
                    }
                  }
                  else {
                    if (iVar6 != 2) {
LAB_00149ccb:
                      pcVar59 = "not supported file type for private key";
                      pSVar18 = unaff_R12;
                      goto LAB_00149eea;
                    }
LAB_00149cf2:
                    pXVar22 = pXVar37;
                    iVar6 = SSL_CTX_use_PrivateKey_file(pSVar18,(char *)pXVar22,iVar6);
                    if (iVar6 != 1) {
                      pXVar37 = (X509 *)"PEM";
                      if (type != (X509 *)0x0) {
                        pXVar37 = type;
                      }
                      pcVar59 = "unable to set private key file: \'%s\' type %s";
                      pSVar18 = unaff_R12;
                      goto LAB_00149ea6;
                    }
                  }
LAB_00149d0d:
                  pSVar40 = SSL_new(pSVar18);
                  if (pSVar40 != (SSL *)0x0) {
                    local_8b8 = SSL_get_certificate(pSVar40);
                    if (local_8b8 != (X509 *)0x0) {
                      pEVar29 = X509_get_pubkey(local_8b8);
                      peVar38 = SSL_get_privatekey(pSVar40);
                      EVP_PKEY_copy_parameters(pEVar29,peVar38);
                      EVP_PKEY_free(pEVar29);
                    }
                    peVar38 = SSL_get_privatekey(pSVar40);
                    iVar6 = EVP_PKEY_get_id(peVar38);
                    if (iVar6 == 6) {
                      r = EVP_PKEY_get1_RSA(peVar38);
                      uVar7 = RSA_flags(r);
                      RSA_free(r);
                      SSL_free(pSVar40);
                      if ((uVar7 & 1) == 0) goto LAB_00149eb7;
                    }
                    else {
                      SSL_free(pSVar40);
LAB_00149eb7:
                      iVar6 = SSL_CTX_check_private_key(pSVar18);
                      if (iVar6 == 0) {
                        pcVar59 = "Private key does not match the certificate public key";
                        pSVar18 = unaff_R12;
                        goto LAB_00149eea;
                      }
                    }
                    iVar6 = 0;
                    goto LAB_00149efc;
                  }
                  pcVar59 = "unable to create an SSL structure";
                  pSVar18 = unaff_R12;
                }
                else if (iVar6 == 0x2a) {
                  if ((pCVar60->state).engine == (void *)0x0) {
                    pcVar59 = "crypto engine not set, can\'t load private key";
                    pSVar18 = unaff_R12;
                  }
                  else {
                    method = UI_create_method("curl user interface");
                    if (method == (UI_METHOD *)0x0) {
                      pcVar59 = "unable do create OpenSSL user-interface method";
                      pSVar18 = unaff_R12;
                    }
                    else {
                      pUVar39 = UI_OpenSSL();
                      iVar6 = UI_method_get_opener((UI *)pUVar39);
                      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar6));
                      pUVar39 = UI_OpenSSL();
                      iVar6 = UI_method_get_closer((UI *)pUVar39);
                      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar6));
                      UI_method_set_reader(method,ssl_ui_reader);
                      UI_method_set_writer(method,ssl_ui_writer);
                      pEVar29 = ENGINE_load_private_key
                                          ((ENGINE *)(pCVar60->state).engine,(char *)local_8d8,
                                           method,pcVar59);
                      UI_destroy_method(method);
                      if (pEVar29 != (EVP_PKEY *)0x0) {
                        iVar6 = SSL_CTX_use_PrivateKey(pSVar18,pEVar29);
                        if (iVar6 == 1) {
                          EVP_PKEY_free(pEVar29);
                          goto LAB_00149d0d;
                        }
                        Curl_failf(pCVar60,"unable to set private key");
                        EVP_PKEY_free(pEVar29);
                        goto LAB_00149ef6;
                      }
                      pcVar59 = "failed to load private key from crypto engine";
                      pSVar18 = unaff_R12;
                    }
                  }
                }
                else {
                  if (iVar6 != 0x2b) goto LAB_00149ccb;
                  if ((int)unaff_R12 != 0) goto LAB_00149d0d;
                  pcVar59 = "file type P12 for private key not supported";
                  pSVar18 = unaff_R12;
                }
LAB_00149eea:
                Curl_failf(pCVar60,pcVar59);
                unaff_R12 = pSVar18;
              }
              else {
                if (iVar6 == 2) {
                  iVar6 = SSL_CTX_use_certificate_file(pSVar18,(char *)pXVar22,2);
                  if (iVar6 == 1) goto LAB_00149095;
                  uVar14 = ERR_get_error();
                  ERR_error_string_n(uVar14,(char *)local_838,0x100);
                  pcVar59 = 
                  "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
LAB_00149244:
                  pXVar37 = local_838;
                }
                else {
LAB_00149069:
                  pcVar59 = "not supported file type \'%s\' for certificate";
                }
                Curl_failf(pCVar60,pcVar59,pXVar37);
              }
LAB_00149ef6:
              iVar6 = 1;
            }
            else {
              if (iVar6 == 0x2a) {
                e = (ENGINE *)(pCVar60->state).engine;
                if (e == (ENGINE *)0x0) {
                  pcVar59 = "crypto engine not set, can\'t load certificate";
                }
                else {
                  local_8b0 = (X509 *)0x0;
                  local_8b8 = pXVar22;
                  iVar6 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
                  if (iVar6 != 0) {
                    iVar6 = ENGINE_ctrl_cmd((ENGINE *)(pCVar60->state).engine,"LOAD_CERT_CTRL",0,
                                            &local_8b8,(f *)0x0,1);
                    if (iVar6 != 0) {
                      if (local_8b0 == (X509 *)0x0) {
                        pcVar59 = "ssl engine didn\'t initialized the certificate properly.";
                        goto LAB_00149eea;
                      }
                      iVar6 = SSL_CTX_use_certificate(pSVar18,local_8b0);
                      if (iVar6 == 1) {
                        X509_free(local_8b0);
                        goto LAB_00149095;
                      }
                      Curl_failf(pCVar60,"unable to set client certificate");
                      X509_free(local_8b0);
                      goto LAB_00149ef6;
                    }
                    uVar14 = ERR_get_error();
                    pXVar37 = local_838;
                    ERR_error_string_n(uVar14,(char *)pXVar37,0x100);
                    pcVar59 = "ssl engine cannot load client cert with id \'%s\' [%s]";
LAB_00149ea6:
                    Curl_failf(pCVar60,pcVar59,pXVar22,pXVar37);
                    unaff_R12 = pSVar18;
                    goto LAB_00149ef6;
                  }
                  pcVar59 = "ssl engine does not support loading certificates";
                }
                goto LAB_00149eea;
              }
              if (iVar6 != 0x2b) goto LAB_00149069;
              local_948 = (ASN1_GENERALIZEDTIME *)0x0;
              pFVar34 = fopen64((char *)pXVar22,"rb");
              if (pFVar34 == (FILE *)0x0) {
                pcVar16 = "could not open PKCS12 file \'%s\'";
LAB_001498c6:
                Curl_failf(pCVar60,pcVar16,pXVar22);
LAB_001498d7:
                unaff_R12 = (SSL_CTX *)0x0;
                iVar6 = 1;
              }
              else {
                p12 = d2i_PKCS12_fp(pFVar34,(PKCS12 **)0x0);
                fclose(pFVar34);
                if (p12 == (PKCS12 *)0x0) {
                  pcVar16 = "error reading PKCS12 file \'%s\'";
                  goto LAB_001498c6;
                }
                PKCS12_PBE_add();
                iVar6 = PKCS12_parse(p12,pcVar59,(EVP_PKEY **)&local_940,&local_8b8,
                                     (stack_st_X509 **)&local_948);
                if (iVar6 == 0) {
                  uVar14 = ERR_get_error();
                  ERR_error_string_n(uVar14,(char *)local_838,0x100);
                  Curl_failf(pCVar60,"could not parse PKCS12 file, check password, OpenSSL error %s"
                             ,local_838);
                  PKCS12_free(p12);
                  goto LAB_001498d7;
                }
                PKCS12_free(p12);
                iVar6 = SSL_CTX_use_certificate(pSVar18,local_8b8);
                if (iVar6 == 1) {
                  iVar6 = SSL_CTX_use_PrivateKey(pSVar18,(EVP_PKEY *)local_940);
                  pXVar37 = pXVar22;
                  if (iVar6 != 1) {
                    pcVar16 = "unable to use private key from PKCS12 file \'%s\'";
                    goto LAB_00149c37;
                  }
                  iVar6 = SSL_CTX_check_private_key(pSVar18);
                  if (iVar6 == 0) {
                    pcVar16 = 
                    "private key from PKCS12 file \'%s\' does not match certificate in same file";
                    goto LAB_00149c37;
                  }
                  if (local_948 == (ASN1_GENERALIZEDTIME *)0x0) {
                    bVar62 = false;
                    goto LAB_00149c41;
                  }
                  do {
                    iVar6 = OPENSSL_sk_num(local_948);
                    bVar62 = iVar6 != 0;
                    if (iVar6 == 0) goto LAB_00149c41;
                    pXVar37 = (X509 *)OPENSSL_sk_pop(local_948);
                    iVar6 = SSL_CTX_add_client_CA(pSVar18,pXVar37);
                    pcVar16 = "cannot add certificate to client CA list";
                    if (iVar6 == 0) {
LAB_00148f83:
                      X509_free(pXVar37);
                      Curl_failf(pCVar60,pcVar16);
                      iVar6 = 3;
                    }
                    else {
                      iVar6 = 0;
                      lVar48 = SSL_CTX_ctrl(pSVar18,0xe,0,pXVar37);
                      pcVar16 = "cannot add certificate to certificate chain";
                      if (lVar48 == 0) goto LAB_00148f83;
                    }
                  } while (iVar6 == 0);
                  bVar62 = true;
                  if (iVar6 == 3) goto LAB_00149c41;
                  unaff_R12 = (SSL_CTX *)0x0;
                }
                else {
                  uVar14 = ERR_get_error();
                  ERR_error_string_n(uVar14,(char *)local_838,0x100);
                  pcVar16 = "could not load PKCS12 client certificate, OpenSSL error %s";
                  pXVar37 = local_838;
LAB_00149c37:
                  Curl_failf(pCVar60,pcVar16,pXVar37);
                  bVar62 = true;
LAB_00149c41:
                  EVP_PKEY_free((EVP_PKEY *)local_940);
                  X509_free(local_8b8);
                  OPENSSL_sk_pop_free(local_948);
                  iVar6 = 2 - (uint)bVar62;
                  unaff_R12 = (SSL_CTX *)(ulong)(bVar62 ^ 1);
                }
              }
              if (iVar6 == 2) goto LAB_00149c86;
            }
LAB_00149efc:
            if (iVar6 != 0) {
              CVar8 = CURLE_SSL_CERTPROBLEM;
              goto LAB_0014799c;
            }
          }
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar48 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0x338;
        }
        pcVar59 = *(char **)((conn->chunk).hexbuffer + lVar48 + -0x20);
        if (pcVar59 != (char *)0x0) {
          iVar6 = SSL_CTX_set_cipher_list((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,pcVar59);
          if (iVar6 == 0) {
            Curl_failf(pCVar53,"failed setting cipher list: %s",pcVar59);
            CVar8 = CURLE_SSL_CIPHER;
            goto LAB_0014799c;
          }
          Curl_infof(pCVar53,"Cipher selection: %s\n",pcVar59);
        }
        pSVar18 = local_8d0;
        iVar6 = (int)local_900;
        if (local_928 != (char *)0x0 || local_8d0 != (SSL_CTX *)0x0) {
          if ((int)local_900 == 0) {
            Curl_infof(pCVar53,
                       "ignoring certificate verify locations due to disabled peer verification\n");
          }
          else {
            iVar47 = SSL_CTX_load_verify_locations
                               ((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,local_928,
                                (char *)local_8d0);
            pcVar59 = local_928;
            if (local_928 == (char *)0x0) {
              pcVar59 = "none";
            }
            pSVar43 = (SSL_CTX *)0x14f27a;
            if (pSVar18 != (SSL_CTX *)0x0) {
              pSVar43 = pSVar18;
            }
            if (iVar47 == 0) {
              Curl_failf(pCVar53,
                         "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                         pcVar59,pSVar43);
              CVar8 = CURLE_SSL_CACERT_BADFILE;
              goto LAB_0014799c;
            }
            Curl_infof(pCVar53,
                       "successfully set certificate verify locations:\n  CAfile: %s\n  CApath: %s\n"
                      );
          }
        }
        if (local_8f8 != (char *)0x0) {
          pXVar35 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx);
          m = X509_LOOKUP_file();
          ctx = X509_STORE_add_lookup(pXVar35,m);
          pcVar59 = local_8f8;
          if ((ctx == (X509_LOOKUP *)0x0) ||
             (iVar6 = X509_load_crl_file(ctx,local_8f8,1), iVar6 == 0)) {
            Curl_failf(pCVar53,"error loading CRL file: %s",pcVar59);
            CVar8 = CURLE_SSL_CRL_BADFILE;
            goto LAB_0014799c;
          }
          Curl_infof(pCVar53,"successfully load CRL file:\n");
          pXVar35 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx);
          X509_STORE_set_flags(pXVar35,0xc);
          Curl_infof(pCVar53,"  CRLfile: %s\n",pcVar59);
          iVar6 = (int)local_900;
        }
        SSL_CTX_set_verify((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx,iVar6,(callback *)0x0);
        if (keylog_file_fp != (FILE *)0x0) {
          SSL_CTX_set_keylog_callback((conn->ssl[lVar12].backend)->ctx,ossl_keylog_callback);
        }
        p_Var3 = (pCVar53->set).ssl.fsslctx;
        if ((p_Var3 != (curl_ssl_ctx_callback)0x0) &&
           (CVar8 = (*p_Var3)(pCVar53,(conn->ssl[lVar12].backend)->ctx,(pCVar53->set).ssl.fsslctxp),
           CVar8 != CURLE_OK)) {
          Curl_failf(pCVar53,"error signaled by ssl ctx callback");
          goto LAB_0014799c;
        }
        pSVar40 = (SSL *)(conn->ssl[lVar12].backend)->handle;
        if (pSVar40 != (SSL *)0x0) {
          SSL_free(pSVar40);
        }
        pSVar40 = SSL_new((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx);
        pCVar60 = local_910;
        (conn->ssl[lVar12].backend)->handle = (SSL *)pSVar40;
        if (pSVar40 == (SSL *)0x0) {
          Curl_failf(pCVar53,"SSL: couldn\'t create a context (handle)!");
          goto LAB_00147c9d;
        }
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_0014a190:
            SSL_ctrl(pSVar40,0x41,1,(void *)0x0);
          }
        }
        else if ((conn->ssl_config).verifystatus == true) goto LAB_0014a190;
        SSL_set_connect_state((SSL *)(conn->ssl[lVar12].backend)->handle);
        (conn->ssl[lVar12].backend)->server_cert = (X509 *)0x0;
        iVar6 = inet_pton(2,(char *)pCVar60,&local_8b8);
        if (((iVar6 == 0) && (iVar6 = inet_pton(10,(char *)pCVar60,&local_8b8), iVar6 == 0)) &&
           (lVar48 = SSL_ctrl((SSL *)(conn->ssl[lVar12].backend)->handle,0x37,0,pCVar60),
           lVar48 == 0)) {
          Curl_infof(pCVar53,
                     "WARNING: failed to configure server name indication (SNI) TLS extension\n");
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
          if ((pCVar53->set).ssl.primary.sessionid == true) goto LAB_0014a2a3;
LAB_0014a307:
          lVar48 = local_8e0;
          if ((&conn->proxy_ssl[0].use)[local_8e0 * 8] == true) {
            pBVar19 = BIO_f_ssl();
            pBVar20 = BIO_new(pBVar19);
            BIO_ctrl(pBVar20,0x6d,0,(&conn->proxy_ssl[0].backend)[lVar48]->handle);
            SSL_set_bio((SSL *)(conn->ssl[lVar12].backend)->handle,pBVar20,pBVar20);
          }
          else {
            iVar6 = SSL_set_fd((SSL *)(conn->ssl[lVar12].backend)->handle,(int)local_908);
            if (iVar6 == 0) {
              uVar14 = ERR_get_error();
              ERR_error_string_n(uVar14,(char *)local_838,0x100);
              pcVar59 = "SSL: SSL_set_fd failed: %s";
              goto LAB_0014a3db;
            }
          }
          conn->ssl[lVar12].connecting_state = ssl_connect_2;
          CVar8 = CURLE_OK;
          goto LAB_0014799c;
        }
        if ((pCVar53->set).proxy_ssl.primary.sessionid == false) goto LAB_0014a307;
LAB_0014a2a3:
        local_940 = (SSL_SESSION *)0x0;
        Curl_ssl_sessionid_lock(conn);
        _Var5 = Curl_ssl_getsessionid(conn,&local_940,(size_t *)0x0,(int)local_920);
        if (_Var5) {
LAB_0014a2ff:
          Curl_ssl_sessionid_unlock(conn);
          goto LAB_0014a307;
        }
        iVar6 = SSL_set_session((SSL *)(conn->ssl[lVar12].backend)->handle,local_940);
        if (iVar6 != 0) {
          Curl_infof(pCVar53,"SSL re-using session ID\n");
          goto LAB_0014a2ff;
        }
        Curl_ssl_sessionid_unlock(conn);
        uVar14 = ERR_get_error();
        ERR_error_string_n(uVar14,(char *)local_838,0x100);
        pcVar59 = "SSL: SSL_set_session failed: %s";
LAB_0014a3db:
        Curl_failf(pCVar53,pcVar59,local_838);
      }
      else {
switchD_00147b49_default:
        Curl_failf(pCVar53,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      }
      CVar8 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_0014799c:
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  pCVar53 = local_938;
  while (sVar1 = conn->ssl[lVar12].connecting_state, sVar1 - ssl_connect_2 < 3) {
    timeout_ms = Curl_timeleft(pCVar53,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_001479b7;
    sVar1 = conn->ssl[lVar12].connecting_state;
    if ((sVar1 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar1 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_930;
      }
      readfd0 = -1;
      if (sVar1 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_930;
      }
      if (nonblocking) {
        timeout_ms = 0;
      }
      iVar6 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar6 < 0) {
        puVar13 = (uint *)__errno_location();
        bVar62 = false;
        Curl_failf(pCVar53,"select/poll on SSL socket, errno: %d",(ulong)*puVar13);
        unaff_R12 = (SSL_CTX *)0x23;
      }
      else {
        bVar62 = true;
        if (iVar6 == 0) {
          if (nonblocking) {
            *local_8c0 = false;
            bVar62 = false;
            unaff_R12 = (SSL_CTX *)0x0;
          }
          else {
            bVar62 = false;
            Curl_failf(pCVar53,"SSL connection timeout");
            unaff_R12 = (SSL_CTX *)0x1c;
          }
        }
      }
      if (!bVar62) {
        return (CURLcode)unaff_R12;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar48 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar48 = 0x638;
    }
    pCVar60 = conn->data;
    ERR_clear_error();
    iVar6 = SSL_connect((SSL *)(conn->ssl[lVar12].backend)->handle);
    if (iVar6 == 1) {
      conn->ssl[lVar12].connecting_state = ssl_connect_3;
      pSVar40 = (SSL *)(conn->ssl[lVar12].backend)->handle;
      pcVar59 = "";
      if (pSVar40 != (SSL *)0x0) {
        iVar6 = SSL_version(pSVar40);
        pcVar59 = "TLSv1.3";
        switch(iVar6) {
        case 0x300:
          pcVar59 = "SSLv3";
          break;
        case 0x301:
          pcVar59 = "TLSv1.0";
          break;
        case 0x302:
          pcVar59 = "TLSv1.1";
          break;
        case 0x303:
          pcVar59 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar6 == 2) {
            pcVar59 = "SSLv2";
          }
          else {
            pcVar59 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar12].backend)->handle);
      pcVar16 = SSL_CIPHER_get_name(c);
      CVar46 = CURLE_OK;
      CVar8 = CURLE_OK;
      Curl_infof(pCVar60,"SSL connection using %s / %s\n",pcVar59,pcVar16);
      pCVar53 = local_938;
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected((conn->ssl[lVar12].backend)->handle,local_838,&local_8b8);
        pCVar53 = local_938;
        if ((int)local_8b8 == 0) {
          Curl_infof(pCVar60,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar60,"ALPN, server accepted to use %.*s\n",(ulong)local_8b8 & 0xffffffff,
                     CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
          CVar8 = CVar46;
          if (((int)local_8b8 == 8) &&
             (*(long *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_) ==
              0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar7 = SSL_get_error((SSL *)(conn->ssl[lVar12].backend)->handle,iVar6);
      if (uVar7 == 3) {
        conn->ssl[lVar12].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar7 != 2) {
          memset(local_838,0,0x100);
          conn->ssl[lVar12].connecting_state = ssl_connect_2;
          uVar14 = ERR_get_error();
          uVar11 = (uint)uVar14;
          if ((((int)uVar11 < 0) || ((uVar11 & 0xff800000) != 0xa000000)) ||
             ((uVar11 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar14,(char *)local_838,0x100);
            CVar8 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar15 = SSL_get_verify_result((SSL *)(conn->ssl[lVar12].backend)->handle);
            if (lVar15 == 0) {
              local_838[0].signature = (ASN1_BIT_STRING *)0x6163696669726576;
              local_838[0]._24_8_ = 0x696166206e6f6974;
              local_838[0].cert_info._0_1_ = 0x53;
              local_838[0].cert_info._1_7_ = 0x74726563204c53;
              local_838[0].sig_alg._0_1_ = 0x69;
              local_838[0].sig_alg._1_7_ = 0x20657461636966;
              local_838[0].name._0_4_ = 0x64656c;
            }
            else {
              *(long *)((long)pCVar60->sockets + lVar48 + -0x80) = lVar15;
              pcVar59 = X509_verify_cert_error_string(lVar15);
              curl_msnprintf((char *)local_838,0x100,"SSL certificate problem: %s",pcVar59);
            }
            CVar8 = CURLE_SSL_CACERT;
          }
          if (uVar14 == 0) {
            cVar2 = (conn->http_proxy).proxytype;
            if ((cVar2 != CURLPROXY_HTTPS) ||
               (phVar4 = &(conn->http_proxy).host,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              phVar4 = &conn->host;
            }
            if ((cVar2 == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              lVar48 = conn->port;
            }
            else {
              lVar48 = (long)conn->remote_port;
            }
            pcVar59 = "SSL_ERROR unknown";
            if (uVar7 < 0xb) {
              pcVar59 = (&PTR_anon_var_dwarf_103bcc_00164c60)[uVar7];
            }
            Curl_failf(pCVar60,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar59,
                       phVar4->name,lVar48);
          }
          else {
            Curl_failf(pCVar60,"%s",local_838);
          }
          goto LAB_0014774f;
        }
        conn->ssl[lVar12].connecting_state = ssl_connect_2_reading;
      }
      CVar8 = CURLE_OK;
    }
LAB_0014774f:
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((nonblocking) && (conn->ssl[lVar12].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar1 != ssl_connect_3) goto LAB_00149acd;
  pCVar53 = conn->data;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if ((pCVar53->set).proxy_ssl.primary.sessionid == false) goto LAB_00147dd7;
LAB_00147ccb:
    local_838[0].cert_info._0_1_ = 0;
    local_838[0].cert_info._1_7_ = 0;
    pSVar33 = SSL_get1_session((SSL *)(conn->ssl[lVar12].backend)->handle);
    Curl_ssl_sessionid_lock(conn);
    _Var5 = Curl_ssl_getsessionid(conn,&local_838[0].cert_info,(size_t *)0x0,(int)local_920);
    if ((_Var5) ||
       ((SSL_SESSION *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_) ==
        pSVar33)) {
      if (_Var5) goto LAB_00147d3e;
      SSL_SESSION_free(pSVar33);
LAB_00147dc3:
      Curl_ssl_sessionid_unlock(conn);
      bVar62 = true;
    }
    else {
      Curl_infof(pCVar53,"old SSL session ID is stale, removing\n");
      Curl_ssl_delsessionid
                (conn,(void *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
LAB_00147d3e:
      CVar8 = Curl_ssl_addsessionid(conn,pSVar33,0,(int)local_920);
      if (CVar8 == CURLE_OK) goto LAB_00147dc3;
      pSVar33 = (SSL_SESSION *)(ulong)CVar8;
      Curl_ssl_sessionid_unlock(conn);
      bVar62 = false;
      Curl_failf(pCVar53,"failed to store ssl session");
    }
    CVar8 = (CURLcode)pSVar33;
    if (bVar62) goto LAB_00147dd7;
  }
  else {
    if ((pCVar53->set).ssl.primary.sessionid == true) goto LAB_00147ccb;
LAB_00147dd7:
    cVar2 = (conn->http_proxy).proxytype;
    if ((cVar2 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      cVar51 = (conn->proxy_ssl_config).verifypeer;
    }
    else {
      cVar51 = (conn->ssl_config).verifypeer;
    }
    cVar41 = '\x01';
    if (cVar51 == '\0') {
      if ((cVar2 != CURLPROXY_HTTPS) ||
         (lVar48 = 0x351, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar48 = 0x309;
      }
      cVar41 = (conn->chunk).hexbuffer[lVar48 + -0x20];
    }
    local_928 = (char *)CONCAT71(local_928._1_7_,cVar41);
    pCVar53 = conn->data;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (local_8e0 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      local_8e0 = 0x638;
    }
    pBVar19 = BIO_s_mem();
    pBVar20 = BIO_new(pBVar19);
    if ((pCVar53->set).ssl.certinfo == true) {
      pCVar60 = conn->data;
      psVar21 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar12].backend)->handle);
      if (psVar21 != (stack_st_X509 *)0x0) {
        local_920 = psVar21;
        iVar6 = OPENSSL_sk_num(psVar21);
        CVar8 = Curl_ssl_init_certinfo(pCVar60,iVar6);
        if (CVar8 == CURLE_OK) {
          local_910 = pCVar53;
          pBVar19 = BIO_s_mem();
          out = BIO_new(pBVar19);
          if (0 < iVar6) {
            iVar47 = 0;
            local_938 = pCVar60;
            do {
              pXVar22 = (X509 *)OPENSSL_sk_value(local_920,iVar47);
              local_8f0 = (ASN1_GENERALIZEDTIME *)0x0;
              pXVar23 = X509_get_subject_name(pXVar22);
              X509_NAME_print_ex(out,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar60,iVar47,"Subject",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              pXVar23 = X509_get_issuer_name(pXVar22);
              X509_NAME_print_ex(out,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar60,iVar47,"Issuer",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              uVar25 = X509_get_version(pXVar22);
              BIO_printf(out,"%lx",uVar25);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar60,iVar47,"Version",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              local_930 = pXVar22;
              pAVar26 = X509_get_serialNumber(pXVar22);
              if (pAVar26->type == 0x102) {
                BIO_puts(out,"-");
              }
              if (0 < pAVar26->length) {
                lVar48 = 0;
                do {
                  BIO_printf(out,"%02x",(ulong)pAVar26->data[lVar48]);
                  lVar48 = lVar48 + 1;
                } while (lVar48 < pAVar26->length);
              }
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              pCVar53 = local_938;
              Curl_ssl_push_certinfo_len(local_938,iVar47,"Serial Number",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              local_918 = (X509 *)0x0;
              pAVar27 = ASN1_STRING_new();
              if (pAVar27 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_8f0,&local_918,local_930);
                X509_signature_print(out,(X509_ALGOR *)local_918,pAVar27);
                ASN1_STRING_free(pAVar27);
                if (local_918 != (X509 *)0x0) {
                  i2a_ASN1_OBJECT(out,(ASN1_OBJECT *)local_918->cert_info);
                  sVar24 = BIO_ctrl(out,3,0,&local_948);
                  Curl_ssl_push_certinfo_len
                            (pCVar53,iVar47,"Public Key Algorithm",(char *)local_948,sVar24);
                  BIO_ctrl(out,1,0,(void *)0x0);
                }
              }
              uVar25 = X509_get0_extensions(local_930);
              iVar9 = OPENSSL_sk_num(uVar25);
              if ((0 < iVar9) && (iVar9 = OPENSSL_sk_num(uVar25), 0 < iVar9)) {
                iVar9 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar25,iVar9);
                  pBVar19 = BIO_s_mem();
                  out_00 = BIO_new(pBVar19);
                  if (out_00 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)&local_8b8,0x80,a);
                  iVar10 = X509V3_EXT_print(out_00,ex,0,0);
                  if (iVar10 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(out_00,v);
                  }
                  BIO_ctrl(out_00,0x73,0,&local_940);
                  uVar14._0_4_ = local_940->ssl_version;
                  uVar14._4_4_ = local_940->key_arg_length;
                  if (uVar14 != 0) {
                    pXVar22 = local_838;
                    uVar57 = 0;
                    do {
                      lVar48 = *(long *)local_940->key_arg;
                      bVar62 = *(char *)(lVar48 + uVar57) == '\n';
                      pcVar59 = "";
                      if (bVar62) {
                        pcVar59 = ", ";
                      }
                      uVar57 = bVar62 + uVar57;
                      if (uVar57 < uVar14) {
                        cVar51 = *(char *)(lVar48 + uVar57);
                        uVar58 = uVar57;
                        while (cVar51 == ' ') {
                          uVar57 = uVar14;
                          if (uVar14 <= uVar58 + 1) goto LAB_001482c3;
                          cVar51 = *(char *)(lVar48 + 1 + uVar58);
                          uVar58 = uVar58 + 1;
                        }
                        iVar10 = curl_msnprintf((char *)pXVar22,(size_t)(local_638 + -(long)pXVar22)
                                                ,"%s%c",pcVar59,(ulong)(uint)(int)cVar51);
                        pXVar22 = (X509 *)((long)&pXVar22->cert_info + (long)iVar10);
                        uVar57 = uVar58;
                      }
LAB_001482c3:
                      uVar57 = uVar57 + 1;
                      uVar14._0_4_ = local_940->ssl_version;
                      uVar14._4_4_ = local_940->key_arg_length;
                    } while (uVar57 < uVar14);
                  }
                  Curl_ssl_push_certinfo(local_938,iVar47,(char *)&local_8b8,(char *)local_838);
                  BIO_free(out_00);
                  iVar9 = iVar9 + 1;
                  iVar10 = OPENSSL_sk_num(uVar25);
                } while (iVar9 < iVar10);
              }
              pXVar22 = local_930;
              pAVar28 = (ASN1_TIME *)X509_get0_notBefore(local_930);
              ASN1_TIME_print(out,pAVar28);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              pCVar53 = local_938;
              Curl_ssl_push_certinfo_len(local_938,iVar47,"Start date",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              pAVar28 = (ASN1_TIME *)X509_get0_notAfter(pXVar22);
              ASN1_TIME_print(out,pAVar28);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar53,iVar47,"Expire date",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              pEVar29 = X509_get_pubkey(pXVar22);
              if (pEVar29 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar53,"   Unable to load public key\n");
              }
              else {
                iVar9 = EVP_PKEY_get_id(pEVar29);
                if (iVar9 == 0x74) {
                  uVar25 = EVP_PKEY_get0_DSA(pEVar29);
                  DSA_get0_pqg(uVar25,local_838,&local_8b8,&local_940);
                  DSA_get0_key(uVar25,&local_918,0);
                  bn = (BIGNUM *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_)
                  ;
                  pcVar59 = "dsa";
LAB_0014859a:
                  pCVar53 = local_938;
                  pubkey_show(local_938,(BIO *)out,iVar47,pcVar59,"p",bn);
                  pubkey_show(pCVar53,(BIO *)out,iVar47,pcVar59,"q",(BIGNUM *)local_8b8);
                  pubkey_show(pCVar53,(BIO *)out,iVar47,pcVar59,"g",(BIGNUM *)local_940);
                  pcVar16 = "pub_key";
                  pXVar22 = local_918;
LAB_00148603:
                  pubkey_show(pCVar53,(BIO *)out,iVar47,pcVar59,pcVar16,(BIGNUM *)pXVar22);
                }
                else {
                  if (iVar9 == 0x1c) {
                    uVar25 = EVP_PKEY_get0_DH(pEVar29);
                    DH_get0_pqg(uVar25,local_838,&local_8b8,&local_940);
                    DH_get0_key(uVar25,&local_918,0);
                    bn = (BIGNUM *)
                         CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_);
                    pcVar59 = "dh";
                    goto LAB_0014859a;
                  }
                  if (iVar9 == 6) {
                    uVar25 = EVP_PKEY_get0_RSA(pEVar29);
                    RSA_get0_key(uVar25,local_838,&local_8b8,0);
                    BN_print(out,(BIGNUM *)
                                 CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_)
                            );
                    sVar24 = BIO_ctrl(out,3,0,&local_948);
                    pCVar53 = local_938;
                    Curl_ssl_push_certinfo_len
                              (local_938,iVar47,"RSA Public Key",(char *)local_948,sVar24);
                    BIO_ctrl(out,1,0,(void *)0x0);
                    pubkey_show(pCVar53,(BIO *)out,iVar47,"rsa","n",
                                (BIGNUM *)
                                CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_))
                    ;
                    pcVar59 = "rsa";
                    pcVar16 = "e";
                    pXVar22 = local_8b8;
                    goto LAB_00148603;
                  }
                }
                EVP_PKEY_free(pEVar29);
              }
              if (local_8f0 != (ASN1_GENERALIZEDTIME *)0x0) {
                if (0 < local_8f0->length) {
                  lVar48 = 0;
                  do {
                    BIO_printf(out,"%02x:",(ulong)local_8f0->data[lVar48]);
                    lVar48 = lVar48 + 1;
                  } while (lVar48 < local_8f0->length);
                }
                sVar24 = BIO_ctrl(out,3,0,&local_948);
                Curl_ssl_push_certinfo_len(local_938,iVar47,"Signature",(char *)local_948,sVar24);
                BIO_ctrl(out,1,0,(void *)0x0);
              }
              PEM_write_bio_X509(out,local_930);
              sVar24 = BIO_ctrl(out,3,0,&local_948);
              pCVar60 = local_938;
              Curl_ssl_push_certinfo_len(local_938,iVar47,"Cert",(char *)local_948,sVar24);
              BIO_ctrl(out,1,0,(void *)0x0);
              iVar47 = iVar47 + 1;
            } while (iVar47 != iVar6);
          }
          BIO_free(out);
          pCVar53 = local_910;
        }
      }
    }
    pXVar30 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar12].backend)->handle);
    (conn->ssl[lVar12].backend)->server_cert = pXVar30;
    if (pXVar30 == (X509 *)0x0) {
      BIO_free(pBVar20);
      CVar8 = CURLE_OK;
      if ((char)local_928 != '\0') {
        Curl_failf(pCVar53,"SSL: couldn\'t get peer certificate!");
        CVar8 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar59 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar59 = "Server";
        }
      }
      else {
        pcVar59 = "Server";
      }
      Curl_infof(pCVar53,"%s certificate:\n",pcVar59);
      pXVar23 = X509_get_subject_name((X509 *)(conn->ssl[lVar12].backend)->server_cert);
      iVar6 = x509_name_oneline((X509_NAME *)pXVar23,(char *)local_838,size);
      pXVar22 = (X509 *)"[NONE]";
      if (iVar6 == 0) {
        pXVar22 = local_838;
      }
      Curl_infof(pCVar53," subject: %s\n",pXVar22);
      pAVar28 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar12].backend)->server_cert);
      ASN1_TIME_print(pBVar20,pAVar28);
      lVar48 = BIO_ctrl(pBVar20,3,0,&local_918);
      Curl_infof(pCVar53," start date: %.*s\n",lVar48);
      BIO_ctrl(pBVar20,1,0,(void *)0x0);
      pAVar28 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar12].backend)->server_cert);
      ASN1_TIME_print(pBVar20,pAVar28);
      lVar48 = BIO_ctrl(pBVar20,3,0,&local_918);
      Curl_infof(pCVar53," expire date: %.*s\n",lVar48);
      BIO_ctrl(pBVar20,1,0,(void *)0x0);
      BIO_free(pBVar20);
      cVar2 = (conn->http_proxy).proxytype;
      if ((cVar2 == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == false) goto LAB_001492b3;
LAB_001488f1:
        if ((cVar2 != CURLPROXY_HTTPS) ||
           (lVar48 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0xd8;
        }
        if ((cVar2 != CURLPROXY_HTTPS) ||
           (lVar15 = 0x168, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar15 = 0xe0;
        }
        pSVar18 = (SSL_CTX *)(conn->ssl[lVar12].backend)->server_cert;
        pCVar60 = conn->data;
        pcVar59 = *(char **)((conn->chunk).hexbuffer + lVar48 + -0x20);
        local_908 = *(undefined8 *)((conn->chunk).hexbuffer + lVar15 + -0x20);
        local_910 = pCVar53;
        local_8f8 = pcVar59;
        if (((conn->bits).ipv6_ip == true) && (iVar6 = inet_pton(10,pcVar59,&local_8b8), iVar6 != 0)
           ) {
          local_938 = (Curl_easy *)CONCAT44(local_938._4_4_,7);
          local_950 = 0x10;
        }
        else {
          iVar6 = inet_pton(2,pcVar59,&local_8b8);
          local_950 = (ulong)((uint)(iVar6 != 0) * 4);
          local_938 = (Curl_easy *)CONCAT44(local_938._4_4_,(uint)(iVar6 != 0) * 5 + 2);
        }
        CVar8 = CURLE_OK;
        psVar21 = (stack_st_X509 *)0x0;
        a_00 = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)pSVar18,0x55,(int *)0x0,(int *)0x0);
        if (a_00 == (GENERAL_NAMES *)0x0) {
          pXVar22 = (X509 *)0x0;
          bVar61 = 0;
        }
        else {
          iVar6 = OPENSSL_sk_num(a_00);
          if (iVar6 < 1) {
            local_930 = (X509 *)0x0;
            bVar61 = 0;
          }
          else {
            iVar47 = 1;
            local_930 = (X509 *)0x0;
            local_920 = (stack_st_X509 *)0x0;
            local_900 = 0;
            bVar61 = 0;
            local_8d0 = pSVar18;
            do {
              piVar31 = (int *)OPENSSL_sk_value(a_00,iVar47 + -1);
              iVar9 = *piVar31;
              uVar44 = (undefined7)((ulong)psVar21 >> 8);
              if (iVar9 == 2) {
                psVar21 = (stack_st_X509 *)CONCAT71(uVar44,1);
                local_930 = (X509 *)psVar21;
              }
              else if (iVar9 == 7) {
                psVar21 = (stack_st_X509 *)CONCAT71(uVar44,1);
                local_920 = psVar21;
              }
              iVar10 = (int)local_938;
              if (iVar9 == (int)local_938) {
                __s = (stack_st_X509 *)ASN1_STRING_get0_data(*(undefined8 *)(piVar31 + 2));
                iVar9 = ASN1_STRING_length(*(ASN1_STRING **)(piVar31 + 2));
                sVar49 = (size_t)iVar9;
                if (iVar10 == 7) {
                  if ((local_950 == sVar49) && (iVar9 = bcmp(__s,&local_8b8,sVar49), iVar9 == 0)) {
                    Curl_infof(pCVar60," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                               local_908);
                    local_900 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                }
                else if (((iVar10 == 2) && (sVar32 = strlen((char *)__s), sVar32 == sVar49)) &&
                        (iVar9 = Curl_cert_hostcheck((char *)__s,local_8f8), iVar9 != 0)) {
                  Curl_infof(pCVar60," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             local_908);
                  bVar61 = 1;
                  psVar21 = __s;
                }
              }
            } while ((iVar47 < iVar6) && (iVar47 = iVar47 + 1, bVar61 == 0));
            local_930 = (X509 *)CONCAT71((int7)((ulong)local_930 >> 8),
                                         (byte)local_930 | (byte)local_920);
            bVar61 = bVar61 | (byte)local_900;
            pSVar18 = local_8d0;
          }
          GENERAL_NAMES_free(a_00);
          pXVar22 = local_930;
        }
        uVar25 = local_908;
        pCVar53 = local_910;
        if ((bVar61 & 1) == 0) {
          if (((ulong)pXVar22 & 1) == 0) {
            local_940 = (SSL_SESSION *)0x15563c;
            pXVar23 = X509_get_subject_name((X509 *)pSVar18);
            if (pXVar23 == (X509_NAME *)0x0) {
              iVar6 = -1;
            }
            else {
              iVar47 = -1;
              do {
                iVar6 = iVar47;
                iVar47 = X509_NAME_get_index_by_NID(pXVar23,0xd,iVar6);
              } while (-1 < iVar47);
            }
            CVar8 = CURLE_OK;
            bVar62 = true;
            if (-1 < iVar6) {
              ne = X509_NAME_get_entry(pXVar23,iVar6);
              pAVar27 = X509_NAME_ENTRY_get_data(ne);
              if (pAVar27 != (ASN1_STRING *)0x0) {
                iVar6 = ASN1_STRING_type(pAVar27);
                if (iVar6 == 0xc) {
                  uVar7 = ASN1_STRING_length(pAVar27);
                  if ((-1 < (int)uVar7) &&
                     (pSVar33 = (SSL_SESSION *)
                                CRYPTO_malloc(uVar7 + 1,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/lib/vtls/openssl.c"
                                              ,0x5c9), local_940 = pSVar33,
                     pSVar33 != (SSL_SESSION *)0x0)) {
                    __src = (void *)ASN1_STRING_get0_data(pAVar27);
                    memcpy(pSVar33,__src,(ulong)uVar7);
                    *(undefined1 *)((long)local_940->key_arg + ((ulong)uVar7 - 8)) = 0;
                  }
                }
                else {
                  uVar7 = ASN1_STRING_to_UTF8((uchar **)&local_940,pAVar27);
                }
                if (local_940 != (SSL_SESSION *)0x0) {
                  sVar49 = strlen((char *)local_940);
                  uVar11 = curlx_uztosi(sVar49);
                  if (uVar11 != uVar7) {
                    bVar62 = false;
                    Curl_failf(pCVar60,"SSL: illegal cert name field");
                    CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
              }
            }
            pCVar53 = local_910;
            if (local_940 == (SSL_SESSION *)0x15563c) {
              local_940 = (SSL_SESSION *)0x0;
            }
            if (bVar62) {
              if (local_940 == (SSL_SESSION *)0x0) {
                Curl_failf(pCVar60,"SSL: unable to obtain common name from peer certificate");
              }
              else {
                iVar6 = Curl_cert_hostcheck((char *)local_940,local_8f8);
                if (iVar6 != 0) {
                  CVar8 = CURLE_OK;
                  Curl_infof(pCVar60," common name: %s (matched)\n");
                  goto LAB_00149290;
                }
                Curl_failf(pCVar60,
                           "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                           ,local_940);
              }
              CVar8 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_00149290:
            if (local_940 != (SSL_SESSION *)0x0) {
              CRYPTO_free(local_940);
            }
          }
          else {
            Curl_infof(pCVar60," subjectAltName does not match %s\n",local_908);
            Curl_failf(pCVar60,
                       "SSL: no alternative certificate subject name matches target host name \'%s\'"
                       ,uVar25);
            CVar8 = CURLE_PEER_FAILED_VERIFICATION;
          }
        }
        if (CVar8 == CURLE_OK) goto LAB_001492b3;
LAB_00149923:
        X509_free((X509 *)(conn->ssl[lVar12].backend)->server_cert);
        (conn->ssl[lVar12].backend)->server_cert = (X509 *)0x0;
      }
      else {
        if ((conn->ssl_config).verifyhost == true) goto LAB_001488f1;
LAB_001492b3:
        pXVar23 = X509_get_issuer_name((X509 *)(conn->ssl[lVar12].backend)->server_cert);
        iVar6 = x509_name_oneline((X509_NAME *)pXVar23,(char *)local_838,size_00);
        if (iVar6 == 0) {
          Curl_infof(pCVar53," issuer: %s\n",local_838);
          cVar2 = (conn->http_proxy).proxytype;
          if ((cVar2 == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            pcVar59 = (pCVar53->set).proxy_ssl.issuercert;
          }
          else {
            pcVar59 = (pCVar53->set).ssl.issuercert;
          }
          if (pcVar59 != (char *)0x0) {
            if ((cVar2 != CURLPROXY_HTTPS) ||
               (lVar48 = 0x6f0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar48 = 0x648;
            }
            pFVar34 = fopen64(*(char **)((long)pCVar53->sockets + lVar48 + -0x80),"r");
            if (pFVar34 == (FILE *)0x0) {
              if ((char)local_928 != '\0') {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (lVar48 = 0x6f0,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar48 = 0x648;
                }
                Curl_failf(pCVar53,"SSL: Unable to open issuer cert (%s)",
                           *(undefined8 *)((long)pCVar53->sockets + lVar48 + -0x80));
              }
              pXVar22 = (X509 *)(conn->ssl[lVar12].backend)->server_cert;
LAB_00149582:
              X509_free(pXVar22);
              (conn->ssl[lVar12].backend)->server_cert = (X509 *)0x0;
            }
            else {
              pXVar22 = PEM_read_X509(pFVar34,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
              if (pXVar22 != (X509 *)0x0) {
                fclose(pFVar34);
                iVar6 = X509_check_issued(pXVar22,(X509 *)(conn->ssl[lVar12].backend)->server_cert);
                if (iVar6 == 0) {
                  if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                     (lVar48 = 0x6f0,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar48 = 0x648;
                  }
                  Curl_infof(pCVar53," SSL certificate issuer check ok (%s)\n",
                             *(undefined8 *)((long)pCVar53->sockets + lVar48 + -0x80));
                  X509_free(pXVar22);
                  goto LAB_001497e3;
                }
                if ((char)local_928 != '\0') {
                  if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                     (lVar48 = 0x6f0,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar48 = 0x648;
                  }
                  Curl_failf(pCVar53,"SSL: Certificate issuer check failed (%s)",
                             *(undefined8 *)((long)pCVar53->sockets + lVar48 + -0x80));
                }
                X509_free((X509 *)(conn->ssl[lVar12].backend)->server_cert);
                goto LAB_00149582;
              }
              if ((char)local_928 != '\0') {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (lVar48 = 0x6f0,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar48 = 0x648;
                }
                Curl_failf(pCVar53,"SSL: Unable to read issuer cert (%s)",
                           *(undefined8 *)((long)pCVar53->sockets + lVar48 + -0x80));
              }
              X509_free((X509 *)(conn->ssl[lVar12].backend)->server_cert);
              X509_free((X509 *)0x0);
              fclose(pFVar34);
            }
            CVar8 = CURLE_SSL_ISSUER_ERROR;
            goto LAB_00149ab8;
          }
LAB_001497e3:
          lVar48 = SSL_get_verify_result((SSL *)(conn->ssl[lVar12].backend)->handle);
          *(long *)((long)pCVar53->sockets + local_8e0 + -0x80) = lVar48;
          if (lVar48 == 0) {
            CVar46 = CURLE_OK;
            Curl_infof(pCVar53," SSL certificate verify ok.\n");
          }
          else {
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_0014988a:
                pcVar59 = X509_verify_cert_error_string(lVar48);
                CVar46 = CURLE_OK;
                Curl_infof(pCVar53," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                           pcVar59,lVar48);
                goto LAB_001492f1;
              }
            }
            else if ((conn->ssl_config).verifypeer != true) goto LAB_0014988a;
            CVar46 = CURLE_PEER_FAILED_VERIFICATION;
            if ((char)local_928 != '\0') {
              pcVar59 = X509_verify_cert_error_string(lVar48);
              Curl_failf(pCVar53,"SSL certificate verify result: %s (%ld)",pcVar59,lVar48);
            }
          }
        }
        else {
          CVar46 = CURLE_SSL_CONNECT_ERROR;
          if ((char)local_928 != '\0') {
            Curl_failf(pCVar53,"SSL: couldn\'t get X509-issuer name!");
          }
        }
LAB_001492f1:
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_0014938c:
            pCVar60 = conn->data;
            lVar48 = SSL_ctrl((SSL *)(conn->ssl[lVar12].backend)->handle,0x46,0,&local_8b8);
            if (local_8b8 == (X509 *)0x0) {
              pcVar59 = "No OCSP response received";
LAB_00149510:
              Curl_failf(pCVar60,pcVar59);
              CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
              bs = (OCSP_BASICRESP *)0x0;
              resp = (Curl_easy *)0x0;
            }
            else {
              resp = (Curl_easy *)
                     d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_8b8,lVar48);
              if (resp == (Curl_easy *)0x0) {
                pcVar59 = "Invalid OCSP response";
                goto LAB_00149510;
              }
              uVar7 = OCSP_response_status((OCSP_RESPONSE *)resp);
              if (uVar7 == 0) {
                bs = OCSP_response_get1_basic((OCSP_RESPONSE *)resp);
                if (bs == (OCSP_BASICRESP *)0x0) {
                  pcVar59 = "Invalid OCSP response";
                  bs = (OCSP_BASICRESP *)0x0;
LAB_001498fa:
                  Curl_failf(pCVar60,pcVar59);
                  goto LAB_00149901;
                }
                psVar21 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar12].backend)->handle);
                pXVar35 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar12].backend)->ctx);
                CVar8 = CURLE_OK;
                iVar6 = OCSP_basic_verify(bs,psVar21,pXVar35,0);
                if (iVar6 < 1) {
                  pcVar59 = "OCSP response verification failed";
                  goto LAB_001498fa;
                }
                iVar6 = OCSP_resp_count(bs);
                if (0 < iVar6) {
                  iVar6 = 0;
                  CVar8 = CURLE_OK;
                  local_938 = resp;
                  do {
                    single = OCSP_resp_get0(bs,iVar6);
                    if (single == (OCSP_SINGLERESP *)0x0) {
                      uVar7 = 5;
                    }
                    else {
                      uVar7 = OCSP_single_get0_status
                                        (single,(int *)&local_8e4,
                                         (ASN1_GENERALIZEDTIME **)&local_940,&local_948,&local_8f0);
                      iVar47 = OCSP_check_validity(local_948,local_8f0,300,-1);
                      if (iVar47 == 0) {
                        Curl_failf(pCVar60,"OCSP response has expired");
                        uVar7 = 2;
                        CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                      else {
                        pcVar59 = OCSP_cert_status_str((long)(int)uVar7);
                        Curl_infof(pCVar60,"SSL certificate status: %s (%d)\n",pcVar59,(ulong)uVar7)
                        ;
                        if (uVar7 != 2) {
                          if (uVar7 != 1) {
                            uVar7 = 0;
                            goto LAB_001496f1;
                          }
                          pcVar59 = OCSP_crl_reason_str((long)(int)local_8e4);
                          Curl_failf(pCVar60,"SSL certificate revocation reason: %s (%d)",pcVar59,
                                     (ulong)local_8e4);
                          uVar7 = 2;
                        }
                        CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                    }
LAB_001496f1:
                    if ((uVar7 != 0) && (uVar7 != 5)) {
                      resp = local_938;
                      if (uVar7 != 2) goto LAB_0014991b;
                      break;
                    }
                    iVar6 = iVar6 + 1;
                    iVar47 = OCSP_resp_count(bs);
                    resp = local_938;
                  } while (iVar6 < iVar47);
                }
              }
              else {
                pcVar59 = OCSP_response_status_str((long)(int)uVar7);
                bs = (OCSP_BASICRESP *)0x0;
                Curl_failf(pCVar60,"Invalid OCSP response status: %s (%d)",pcVar59,(ulong)uVar7);
LAB_00149901:
                CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
              }
            }
            if (bs != (OCSP_BASICRESP *)0x0) {
              OCSP_BASICRESP_free(bs);
            }
            OCSP_RESPONSE_free((OCSP_RESPONSE *)resp);
LAB_0014991b:
            if (CVar8 != CURLE_OK) goto LAB_00149923;
            CVar46 = CURLE_OK;
          }
        }
        else if ((conn->ssl_config).verifystatus == true) goto LAB_0014938c;
        CVar8 = CURLE_OK;
        if ((char)local_928 != '\0') {
          CVar8 = CVar46;
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar48 = 0x8e8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0x8e0;
        }
        pXVar22 = *(X509 **)((long)pCVar53->sockets + lVar48 + -0x80);
        local_918 = pXVar22;
        if (pXVar22 != (X509 *)0x0 && CVar8 == CURLE_OK) {
          pXVar30 = (conn->ssl[lVar12].backend)->server_cert;
          local_8b8 = (X509 *)0x0;
          if (pXVar30 == (X509 *)0x0) {
            CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar36 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
            uVar7 = i2d_X509_PUBKEY(pXVar36,(uchar **)0x0);
            CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            pXVar37 = (X509 *)0x0;
            if (0 < (int)uVar7) {
              uVar14 = (ulong)uVar7;
              pXVar37 = (X509 *)(*Curl_cmalloc)(uVar14);
              local_8b8 = pXVar37;
              if (pXVar37 == (X509 *)0x0) {
                pXVar37 = (X509 *)0x0;
              }
              else {
                pXVar36 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
                uVar11 = i2d_X509_PUBKEY(pXVar36,(uchar **)&local_8b8);
                if ((local_8b8 != (X509 *)0x0 && uVar7 == uVar11) &&
                    (long)local_8b8 - (long)pXVar37 == uVar14) {
                  CVar8 = Curl_pin_peer_pubkey(pCVar53,(char *)pXVar22,(uchar *)pXVar37,uVar14);
                }
              }
            }
            if (pXVar37 != (X509 *)0x0) {
              (*Curl_cfree)(pXVar37);
            }
          }
          if (CVar8 == CURLE_OK) {
            CVar8 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar53,"SSL: public key does not match pinned public key!");
          }
        }
        X509_free((X509 *)(conn->ssl[lVar12].backend)->server_cert);
        (conn->ssl[lVar12].backend)->server_cert = (X509 *)0x0;
        conn->ssl[lVar12].connecting_state = ssl_connect_done;
      }
    }
LAB_00149ab8:
    if (CVar8 == CURLE_OK) {
      conn->ssl[lVar12].connecting_state = ssl_connect_done;
    }
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_00149acd:
  bVar62 = conn->ssl[lVar12].connecting_state == ssl_connect_done;
  if (bVar62) {
    conn->ssl[lVar12].state = ssl_connection_complete;
    conn->recv[local_8c8] = ossl_recv;
    conn->send[local_8c8] = ossl_send;
  }
  *local_8c0 = bVar62;
  conn->ssl[lVar12].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}